

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O1

int zip_add_content_buffer(zipFile *zip,char *filename,char *buf,size_t buflen,int mustfree)

{
  int iVar1;
  tm *ptVar2;
  char *__format;
  time_t now;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  now = time((time_t *)0x0);
  ptVar2 = localtime(&now);
  local_60 = ptVar2->tm_sec;
  local_5c = ptVar2->tm_min;
  local_58 = ptVar2->tm_hour;
  local_54 = ptVar2->tm_mday;
  local_50 = ptVar2->tm_mon;
  local_4c = ptVar2->tm_year;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  iVar1 = zipOpenNewFileInZip(zip,filename,&local_60,0,0,0,0,0,8,9);
  if (iVar1 == 0) {
    iVar1 = zipWriteInFileInZip(zip,buf,buflen & 0xffffffff);
    if (iVar1 == 0) {
      zipCloseFileInZip(zip);
      if (mustfree == 0) {
        return 0;
      }
      free(buf);
      return 0;
    }
    __format = "Error writing to file \"%s\" inside zip file\n";
  }
  else {
    __format = "Error creating file \"%s\" inside zip file\n";
  }
  fprintf(_stderr,__format,filename);
  return 1;
}

Assistant:

int zip_add_content_buffer (ZIPFILETYPE* zip, const char* filename, const char* buf, size_t buflen, int mustfree)
{
#ifdef USE_MINIZIP
  zip_fileinfo zipinfo;
  time_t now = time(NULL);
  struct tm* newtm = localtime(&now);
  zipinfo.tmz_date.tm_sec = newtm->tm_sec;
  zipinfo.tmz_date.tm_min = newtm->tm_min;
  zipinfo.tmz_date.tm_hour = newtm->tm_hour;
  zipinfo.tmz_date.tm_mday = newtm->tm_mday;
  zipinfo.tmz_date.tm_mon = newtm->tm_mon;
  zipinfo.tmz_date.tm_year = newtm->tm_year;
  zipinfo.dosDate = 0;
  zipinfo.internal_fa = 0;
  zipinfo.external_fa = 0;
  if (zipOpenNewFileInZip(zip, filename, &zipinfo, NULL, 0, NULL, 0, NULL, Z_DEFLATED, 9) != ZIP_OK) {
    fprintf(stderr, "Error creating file \"%s\" inside zip file\n", filename);/////
    return 1;
  }
  if (zipWriteInFileInZip(zip, buf, buflen) != ZIP_OK) {
    fprintf(stderr, "Error writing to file \"%s\" inside zip file\n", filename);/////
    return 1;
  }
  zipCloseFileInZip(zip);
  if (mustfree)
    free((char*)buf);
#else
  zip_source_t* zipsrc;
  if ((zipsrc = zip_source_buffer(zip, buf, buflen, mustfree)) == NULL) {
    fprintf(stderr, "Error creating file \"%s\" inside zip file\n", filename);/////
    return 1;
  }
  if (zip_file_add_custom(zip, filename, zipsrc) < 0) {
    fprintf(stderr, "Error in zip_file_add for file %s\n", filename);/////
    zip_source_free(zipsrc);
    return 2;
  }
#endif
  return 0;
}